

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O0

void __thiscall helics::ActionMessage::ActionMessage(ActionMessage *this,void *data,size_t size)

{
  string_view data_00;
  char *in_RDX;
  char *in_RSI;
  ActionMessage *in_stack_ffffffffffffffd0;
  ActionMessage *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  
  ActionMessage(in_stack_ffffffffffffffd0);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffd8,in_RSI,
             (size_type)in_RDX);
  data_00._M_str = in_RDX;
  data_00._M_len = (size_t)in_stack_ffffffffffffffe0;
  from_string(in_stack_ffffffffffffffd8,data_00);
  return;
}

Assistant:

ActionMessage::ActionMessage(const void* data, size_t size): ActionMessage()
{
    from_string(std::string_view(static_cast<const char*>(data), size));
}